

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c++
# Opt level: O3

Date __thiscall kj::anon_unknown_10::PosixClock::now(PosixClock *this)

{
  int iVar1;
  Fault f;
  timespec ts;
  Fault local_40;
  timespec local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  do {
    iVar1 = clock_gettime(this->clockId,&local_38);
    if (-1 < iVar1) goto LAB_0028dcac;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_40.exception = (Exception *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    kj::_::Debug::Fault::init
              (&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/time.c++"
              );
    kj::_::Debug::Fault::fatal(&local_40);
  }
LAB_0028dcac:
  return (Date)(local_38.tv_sec * 1000000000 + local_38.tv_nsec);
}

Assistant:

Date now() const override {
    struct timespec ts;
    KJ_SYSCALL(clock_gettime(clockId, &ts));
    return UNIX_EPOCH + ts.tv_sec * kj::SECONDS + ts.tv_nsec * kj::NANOSECONDS;
  }